

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::DirectStateAccess::Buffers::ClearTest::iterate(ClearTest *this)

{
  PFNGLNAMEDBUFFERDATA p_Var1;
  PFNGLCLEARNAMEDBUFFERDATA p_Var2;
  PFNGLCLEARNAMEDBUFFERSUBDATA p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  bool bVar69;
  int iVar70;
  ContextType ctxType;
  undefined4 extraout_var;
  undefined4 *puVar72;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLubyte reference [4];
  undefined4 uStack_84;
  long lVar71;
  
  iVar70 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar71 = CONCAT44(extraout_var,iVar70);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar5 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar4) || (bVar5)) {
    p_Var1 = *(PFNGLNAMEDBUFFERDATA *)(lVar71 + 0xec0);
    this->m_pNamedBufferData = p_Var1;
    p_Var2 = *(PFNGLCLEARNAMEDBUFFERDATA *)(lVar71 + 0x1d8);
    this->m_pClearNamedBufferData = p_Var2;
    p_Var3 = *(PFNGLCLEARNAMEDBUFFERSUBDATA *)(lVar71 + 0x1e0);
    this->m_pClearNamedBufferSubData = p_Var3;
    if ((p_Var1 == (PFNGLNAMEDBUFFERDATA)0x0) ||
       ((p_Var2 == (PFNGLCLEARNAMEDBUFFERDATA)0x0 || (p_Var3 == (PFNGLCLEARNAMEDBUFFERSUBDATA)0x0)))
       ) {
      puVar72 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar72 = 0;
      __cxa_throw(puVar72,&int::typeinfo,0);
    }
    reference[0] = '\x05';
    reference[1] = '\x01';
    reference[2] = '\x02';
    reference[3] = '\x03';
    bVar4 = TestClearNamedBufferData<unsigned_char,false>(this,0x8229,1,0x1903,0x1401,reference);
    bVar5 = TestClearNamedBufferData<unsigned_char,false>(this,0x822b,2,0x8227,0x1401,reference);
    bVar6 = TestClearNamedBufferData<unsigned_char,false>(this,0x8058,4,0x1908,0x1401,reference);
    bVar7 = TestClearNamedBufferData<unsigned_char,true>(this,0x8229,1,0x1903,0x1401,reference);
    bVar8 = TestClearNamedBufferData<unsigned_char,true>(this,0x822b,2,0x8227,0x1401,reference);
    bVar9 = TestClearNamedBufferData<unsigned_char,true>(this,0x8058,4,0x1908,0x1401,reference);
    bVar10 = TestClearNamedBufferData<unsigned_char,false>(this,0x8232,1,0x1903,0x1401,reference);
    bVar11 = TestClearNamedBufferData<unsigned_char,false>(this,0x8238,2,0x8227,0x1401,reference);
    bVar12 = TestClearNamedBufferData<unsigned_char,false>(this,0x8d7c,4,0x1908,0x1401,reference);
    bVar13 = TestClearNamedBufferData<unsigned_char,true>(this,0x8232,1,0x1903,0x1401,reference);
    bVar14 = TestClearNamedBufferData<unsigned_char,true>(this,0x8238,2,0x8227,0x1401,reference);
    bVar15 = TestClearNamedBufferData<unsigned_char,true>(this,0x8d7c,4,0x1908,0x1401,reference);
    _reference = (undefined1 *)CONCAT44(uStack_84,0x3fe0105);
    bVar16 = TestClearNamedBufferData<signed_char,false>
                       (this,0x8231,1,0x1903,0x1400,(char *)reference);
    bVar17 = TestClearNamedBufferData<signed_char,false>
                       (this,0x8237,2,0x8227,0x1400,(char *)reference);
    bVar18 = TestClearNamedBufferData<signed_char,false>
                       (this,0x8d8e,4,0x1908,0x1400,(char *)reference);
    bVar19 = TestClearNamedBufferData<signed_char,true>
                       (this,0x8231,1,0x1903,0x1400,(char *)reference);
    bVar20 = TestClearNamedBufferData<signed_char,true>
                       (this,0x8237,2,0x8227,0x1400,(char *)reference);
    bVar21 = TestClearNamedBufferData<signed_char,true>
                       (this,0x8d8e,4,0x1908,0x1400,(char *)reference);
    _reference = (undefined1 *)0x3000200010005;
    bVar22 = TestClearNamedBufferData<unsigned_short,false>
                       (this,0x822a,1,0x1903,0x1403,(unsigned_short *)reference);
    bVar23 = TestClearNamedBufferData<unsigned_short,false>
                       (this,0x822c,2,0x8227,0x1403,(unsigned_short *)reference);
    bVar24 = TestClearNamedBufferData<unsigned_short,false>
                       (this,0x805b,4,0x1908,0x1403,(unsigned_short *)reference);
    bVar25 = TestClearNamedBufferData<unsigned_short,true>
                       (this,0x822a,1,0x1903,0x1403,(unsigned_short *)reference);
    bVar26 = TestClearNamedBufferData<unsigned_short,true>
                       (this,0x822c,2,0x8227,0x1403,(unsigned_short *)reference);
    bVar27 = TestClearNamedBufferData<unsigned_short,true>
                       (this,0x805b,4,0x1908,0x1403,(unsigned_short *)reference);
    bVar28 = TestClearNamedBufferData<unsigned_short,false>
                       (this,0x8234,1,0x1903,0x1403,(unsigned_short *)reference);
    bVar29 = TestClearNamedBufferData<unsigned_short,false>
                       (this,0x823a,2,0x8227,0x1403,(unsigned_short *)reference);
    bVar30 = TestClearNamedBufferData<unsigned_short,false>
                       (this,0x8d76,4,0x1908,0x1403,(unsigned_short *)reference);
    bVar31 = TestClearNamedBufferData<unsigned_short,true>
                       (this,0x8234,1,0x1903,0x1403,(unsigned_short *)reference);
    bVar32 = TestClearNamedBufferData<unsigned_short,true>
                       (this,0x823a,2,0x8227,0x1403,(unsigned_short *)reference);
    bVar33 = TestClearNamedBufferData<unsigned_short,true>
                       (this,0x8d76,4,0x1908,0x1403,(unsigned_short *)reference);
    _reference = (undefined1 *)0x3fffe00010005;
    bVar34 = TestClearNamedBufferData<short,false>(this,0x8233,1,0x1903,0x1402,(short *)reference);
    bVar35 = TestClearNamedBufferData<short,false>(this,0x8239,2,0x8227,0x1402,(short *)reference);
    bVar36 = TestClearNamedBufferData<short,false>(this,0x8d88,4,0x1908,0x1402,(short *)reference);
    bVar37 = TestClearNamedBufferData<short,true>(this,0x8233,1,0x1903,0x1402,(short *)reference);
    bVar38 = TestClearNamedBufferData<short,true>(this,0x8239,2,0x8227,0x1402,(short *)reference);
    bVar39 = TestClearNamedBufferData<short,true>(this,0x8d88,4,0x1908,0x1402,(short *)reference);
    _reference = &DAT_100000005;
    bVar40 = TestClearNamedBufferData<unsigned_int,false>
                       (this,0x8236,1,0x1903,0x1405,(uint *)reference);
    bVar41 = TestClearNamedBufferData<unsigned_int,false>
                       (this,0x823c,2,0x8227,0x1405,(uint *)reference);
    bVar42 = TestClearNamedBufferData<unsigned_int,false>
                       (this,0x8d71,3,0x1907,0x1405,(uint *)reference);
    bVar43 = TestClearNamedBufferData<unsigned_int,false>
                       (this,0x8d70,4,0x1908,0x1405,(uint *)reference);
    bVar44 = TestClearNamedBufferData<unsigned_int,true>
                       (this,0x8236,1,0x1903,0x1405,(uint *)reference);
    bVar45 = TestClearNamedBufferData<unsigned_int,true>
                       (this,0x823c,2,0x8227,0x1405,(uint *)reference);
    bVar46 = TestClearNamedBufferData<unsigned_int,true>
                       (this,0x8d71,3,0x1907,0x1405,(uint *)reference);
    bVar47 = TestClearNamedBufferData<unsigned_int,true>
                       (this,0x8d70,4,0x1908,0x1405,(uint *)reference);
    _reference = &DAT_100000005;
    bVar48 = TestClearNamedBufferData<int,false>(this,0x8235,1,0x1903,0x1404,(int *)reference);
    bVar49 = TestClearNamedBufferData<int,false>(this,0x823b,2,0x8227,0x1404,(int *)reference);
    bVar50 = TestClearNamedBufferData<int,false>(this,0x8d83,3,0x1907,0x1404,(int *)reference);
    bVar51 = TestClearNamedBufferData<int,false>(this,0x8d82,4,0x1908,0x1404,(int *)reference);
    bVar52 = TestClearNamedBufferData<int,true>(this,0x8235,1,0x1903,0x1404,(int *)reference);
    bVar53 = TestClearNamedBufferData<int,true>(this,0x823b,2,0x8227,0x1404,(int *)reference);
    bVar54 = TestClearNamedBufferData<int,true>(this,0x8d83,3,0x1907,0x1404,(int *)reference);
    bVar55 = TestClearNamedBufferData<int,true>(this,0x8d82,4,0x1908,0x1404,(int *)reference);
    _reference = (undefined1 *)0x3555c00000003c00;
    bVar56 = TestClearNamedBufferData<unsigned_short,false>
                       (this,0x822d,1,0x1903,0x140b,(unsigned_short *)reference);
    bVar57 = TestClearNamedBufferData<unsigned_short,false>
                       (this,0x822f,2,0x8227,0x140b,(unsigned_short *)reference);
    bVar58 = TestClearNamedBufferData<unsigned_short,false>
                       (this,0x881a,4,0x1908,0x140b,(unsigned_short *)reference);
    bVar59 = TestClearNamedBufferData<unsigned_short,true>
                       (this,0x822d,1,0x1903,0x140b,(unsigned_short *)reference);
    bVar60 = TestClearNamedBufferData<unsigned_short,true>
                       (this,0x822f,2,0x8227,0x140b,(unsigned_short *)reference);
    bVar61 = TestClearNamedBufferData<unsigned_short,true>
                       (this,0x881a,4,0x1908,0x140b,(unsigned_short *)reference);
    _reference = (undefined1 *)0x3f800000;
    bVar62 = TestClearNamedBufferData<float,false>(this,0x822e,1,0x1903,0x1406,(float *)reference);
    bVar63 = TestClearNamedBufferData<float,false>(this,0x8230,2,0x8227,0x1406,(float *)reference);
    bVar64 = TestClearNamedBufferData<float,false>(this,0x8815,3,0x1907,0x1406,(float *)reference);
    bVar65 = TestClearNamedBufferData<float,false>(this,0x8814,4,0x1908,0x1406,(float *)reference);
    bVar66 = TestClearNamedBufferData<float,true>(this,0x822e,1,0x1903,0x1406,(float *)reference);
    bVar67 = TestClearNamedBufferData<float,true>(this,0x8230,2,0x8227,0x1406,(float *)reference);
    bVar68 = TestClearNamedBufferData<float,true>(this,0x8815,3,0x1907,0x1406,(float *)reference);
    bVar69 = TestClearNamedBufferData<float,true>(this,0x8814,4,0x1908,0x1406,(float *)reference);
    do {
      iVar70 = (**(code **)(lVar71 + 0x800))();
    } while (iVar70 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((((((((((bVar60 && bVar61) && bVar62) && bVar63) && bVar64) && bVar65) && bVar66) && bVar67)
         && bVar68) && bVar69) &&
        ((((((((((bVar50 && bVar51) && bVar52) && bVar53) && bVar54) && bVar55) && bVar56) && bVar57
           ) && bVar58) && bVar59) &&
        (((((((((bVar41 && bVar42) && bVar43) && bVar44) && bVar45) && bVar46) && bVar47) && bVar48)
         && bVar49) &&
        ((((((((bVar33 && bVar34) && bVar35) && bVar36) && bVar37) && bVar38) && bVar39) && bVar40)
        && (((((((bVar26 && bVar27) && bVar28) && bVar29) && bVar30) && bVar31) && bVar32) &&
           ((((((bVar20 && bVar21) && bVar22) && bVar23) && bVar24) && bVar25) &&
           (((((bVar15 && bVar16) && bVar17) && bVar18) && bVar19) &&
           ((((bVar11 && bVar12) && bVar13) && bVar14) &&
           (((bVar8 && bVar9) && bVar10) && ((bVar6 && bVar7) && (bVar4 && bVar5))))))))))) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ClearTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	m_pNamedBufferData		   = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pClearNamedBufferData	= (PFNGLCLEARNAMEDBUFFERDATA)gl.clearNamedBufferData;
	m_pClearNamedBufferSubData = (PFNGLCLEARNAMEDBUFFERSUBDATA)gl.clearNamedBufferSubData;

	try
	{
		if ((DE_NULL == m_pNamedBufferData) || (DE_NULL == m_pClearNamedBufferData) ||
			(DE_NULL == m_pClearNamedBufferSubData))
		{
			throw 0;
		}

		{
			/* unsigned byte norm component ClearNamedBufferData tests */
			glw::GLubyte reference[4] = { 5, 1, 2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_R8, 1, GL_RED, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_RG8, 2, GL_RG, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_RGBA8, 4, GL_RGBA, GL_UNSIGNED_BYTE, reference);

			/* unsigned byte norm component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_R8, 1, GL_RED, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_RG8, 2, GL_RG, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_RGBA8, 4, GL_RGBA, GL_UNSIGNED_BYTE, reference);

			/* unsigned byte component ClearNamedBufferData tests */
			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_R8UI, 1, GL_RED, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_RG8UI, 2, GL_RG, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_RGBA8UI, 4, GL_RGBA, GL_UNSIGNED_BYTE, reference);

			/* unsigned byte component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_R8UI, 1, GL_RED, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_RG8UI, 2, GL_RG, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_RGBA8UI, 4, GL_RGBA, GL_UNSIGNED_BYTE, reference);
		}

		{
			/* signed byte component ClearNamedBufferData tests */
			glw::GLbyte reference[4] = { 5, 1, -2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLbyte, false>(GL_R8I, 1, GL_RED, GL_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLbyte, false>(GL_RG8I, 2, GL_RG, GL_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLbyte, false>(GL_RGBA8I, 4, GL_RGBA, GL_BYTE, reference);

			/* signed byte component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLbyte, true>(GL_R8I, 1, GL_RED, GL_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLbyte, true>(GL_RG8I, 2, GL_RG, GL_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLbyte, true>(GL_RGBA8I, 4, GL_RGBA, GL_BYTE, reference);
		}

		{
			/* unsigned short norm component ClearNamedBufferData tests */
			glw::GLushort reference[4] = { 5, 1, 2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLushort, false>(GL_R16, 1, GL_RED, GL_UNSIGNED_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLushort, false>(GL_RG16, 2, GL_RG, GL_UNSIGNED_SHORT, reference);
			is_ok &=
				TestClearNamedBufferData<glw::GLushort, false>(GL_RGBA16, 4, GL_RGBA, GL_UNSIGNED_SHORT, reference);

			/* unsigned short norm component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLushort, true>(GL_R16, 1, GL_RED, GL_UNSIGNED_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLushort, true>(GL_RG16, 2, GL_RG, GL_UNSIGNED_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLushort, true>(GL_RGBA16, 4, GL_RGBA, GL_UNSIGNED_SHORT, reference);

			/* unsigned short component ClearNamedBufferData tests */
			is_ok &= TestClearNamedBufferData<glw::GLushort, false>(GL_R16UI, 1, GL_RED, GL_UNSIGNED_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLushort, false>(GL_RG16UI, 2, GL_RG, GL_UNSIGNED_SHORT, reference);
			is_ok &=
				TestClearNamedBufferData<glw::GLushort, false>(GL_RGBA16UI, 4, GL_RGBA, GL_UNSIGNED_SHORT, reference);

			/* unsigned short component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLushort, true>(GL_R16UI, 1, GL_RED, GL_UNSIGNED_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLushort, true>(GL_RG16UI, 2, GL_RG, GL_UNSIGNED_SHORT, reference);
			is_ok &=
				TestClearNamedBufferData<glw::GLushort, true>(GL_RGBA16UI, 4, GL_RGBA, GL_UNSIGNED_SHORT, reference);
		}

		{
			/* signed short component ClearNamedBufferData tests */
			glw::GLshort reference[4] = { 5, 1, -2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLshort, false>(GL_R16I, 1, GL_RED, GL_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLshort, false>(GL_RG16I, 2, GL_RG, GL_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLshort, false>(GL_RGBA16I, 4, GL_RGBA, GL_SHORT, reference);

			/* signed short component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLshort, true>(GL_R16I, 1, GL_RED, GL_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLshort, true>(GL_RG16I, 2, GL_RG, GL_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLshort, true>(GL_RGBA16I, 4, GL_RGBA, GL_SHORT, reference);
		}

		{
			/* unsigned int component ClearNamedBufferData tests */
			glw::GLuint reference[4] = { 5, 1, 2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLuint, false>(GL_R32UI, 1, GL_RED, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, false>(GL_RG32UI, 2, GL_RG, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, false>(GL_RGB32UI, 3, GL_RGB, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, false>(GL_RGBA32UI, 4, GL_RGBA, GL_UNSIGNED_INT, reference);

			/* unsigned int component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLuint, true>(GL_R32UI, 1, GL_RED, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, true>(GL_RG32UI, 2, GL_RG, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, true>(GL_RGB32UI, 3, GL_RGB, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, true>(GL_RGBA32UI, 4, GL_RGBA, GL_UNSIGNED_INT, reference);
		}

		{
			/* signed int component ClearNamedBufferData tests */
			glw::GLint reference[4] = { 5, 1, -2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLint, false>(GL_R32I, 1, GL_RED, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, false>(GL_RG32I, 2, GL_RG, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, false>(GL_RGB32I, 3, GL_RGB, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, false>(GL_RGBA32I, 4, GL_RGBA, GL_INT, reference);

			/* signed int component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLint, true>(GL_R32I, 1, GL_RED, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, true>(GL_RG32I, 2, GL_RG, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, true>(GL_RGB32I, 3, GL_RGB, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, true>(GL_RGBA32I, 4, GL_RGBA, GL_INT, reference);
		}

		{
			/* half float component ClearNamedBufferData tests */
			glw::GLhalf reference[4] = { 0x3C00 /* 1.0hf */, 0x0000 /* 0.0hf */, 0xC000 /* -2.0hf */,
										 0x3555 /* 0.333333333hf */ };

			is_ok &= TestClearNamedBufferData<glw::GLhalf, false>(GL_R16F, 1, GL_RED, GL_HALF_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLhalf, false>(GL_RG16F, 2, GL_RG, GL_HALF_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLhalf, false>(GL_RGBA16F, 4, GL_RGBA, GL_HALF_FLOAT, reference);

			/* half float component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLhalf, true>(GL_R16F, 1, GL_RED, GL_HALF_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLhalf, true>(GL_RG16F, 2, GL_RG, GL_HALF_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLhalf, true>(GL_RGBA16F, 4, GL_RGBA, GL_HALF_FLOAT, reference);
		}

		{
			/* float component ClearNamedBufferData tests */
			glw::GLfloat reference[4] = { 1.f, 0.f, -2.f, 0.3333333333f };

			is_ok &= TestClearNamedBufferData<glw::GLfloat, false>(GL_R32F, 1, GL_RED, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, false>(GL_RG32F, 2, GL_RG, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, false>(GL_RGB32F, 3, GL_RGB, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, false>(GL_RGBA32F, 4, GL_RGBA, GL_FLOAT, reference);

			/* float component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLfloat, true>(GL_R32F, 1, GL_RED, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, true>(GL_RG32F, 2, GL_RG, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, true>(GL_RGB32F, 3, GL_RGB, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, true>(GL_RGBA32F, 4, GL_RGBA, GL_FLOAT, reference);
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}